

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_aux.cpp
# Opt level: O3

void skiwi::error_label(asmcode *code,string *label_name,runtime_error re)

{
  operand local_44 [3];
  ulong local_38;
  
  local_38._0_4_ = LABEL;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string_const&>
            (code,(operation *)&local_38,label_name);
  local_38 = CONCAT44(local_38._4_4_,0x55);
  local_44[1] = 9;
  local_44[0] = NUMBER;
  local_44[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,local_44 + 1,local_44,(int *)(local_44 + 2));
  local_44[1] = 0x49;
  local_44[0] = RAX;
  local_44[2] = 0x39;
  local_38 = (ulong)re;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_44 + 1,local_44,local_44 + 2,&local_38);
  local_38._0_4_ = SHL;
  local_44[1] = 9;
  local_44[0] = NUMBER;
  local_44[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,local_44 + 1,local_44,(int *)(local_44 + 2));
  local_38._0_4_ = OR;
  local_44[1] = 9;
  local_44[0] = NUMBER;
  local_44[2] = 0x2f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,local_44 + 1,local_44,(int *)(local_44 + 2));
  local_38 = CONCAT44(local_38._4_4_,0x2c);
  local_44[1] = 0x23;
  local_44[0] = 0x100;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            (code,(operation *)&local_38,local_44 + 1,(int *)local_44);
  return;
}

Assistant:

void error_label(asmcode& code, const std::string& label_name, runtime_error re)
  {
  code.add(asmcode::LABEL, label_name);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 8);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, (uint64_t)re);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 8);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, error_tag);
  code.add(asmcode::JMP, ERROR);
  }